

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::truncated_normal_dist<double>::cdf
          (truncated_normal_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  
  dVar2 = ((x - (this->P).mu_) / (this->P).sigma_) * 0.7071067811865476;
  if (-0.4769362762044699 <= dVar2) {
    if (dVar2 <= 0.4769362762044699) {
      dVar2 = erf(dVar2);
      dVar2 = dVar2 * 0.5 + 0.5;
    }
    else {
      dVar2 = erfc(dVar2);
      dVar2 = dVar2 * -0.5 + 1.0;
    }
  }
  else {
    dVar2 = erfc(-dVar2);
    dVar2 = dVar2 * 0.5;
  }
  dVar1 = (this->P).Phi_a;
  return (dVar2 - dVar1) / ((this->P).Phi_b - dVar1);
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return (math::Phi(x) - P.Phi_a) / (P.Phi_b - P.Phi_a);
    }